

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O2

int parse_udp(void *data,char **str,int inv)

{
  char *__s1;
  int iVar1;
  char *str_00;
  byte bVar2;
  double __x;
  
  __s1 = *str;
  str_00 = strtok((char *)0x0," \t\n");
  if (str_00 == (char *)0x0) {
    _log(__x);
LAB_00104ba1:
    iVar1 = -1;
  }
  else {
    iVar1 = strcmp(__s1,"--sport");
    if (iVar1 == 0) {
      iVar1 = parse_port(str_00,(uint16_t *)data);
      if (iVar1 != 0) goto LAB_00104ba1;
      bVar2 = 1;
    }
    else {
      iVar1 = strcmp(__s1,"--dport");
      if (iVar1 != 0) {
        return 0;
      }
      iVar1 = parse_port(str_00,(uint16_t *)((long)data + 4));
      if (iVar1 != 0) goto LAB_00104ba1;
      bVar2 = 2;
    }
    iVar1 = 0;
    if (inv != 0) {
      *(byte *)((long)data + 8) = *(byte *)((long)data + 8) | bVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int parse_udp(void *data, char **str, int inv)
{
	match_udp_t *m = (match_udp_t *)data;
	int inv_type = 0;

	char *p = *str;
	char *q = p;
	q = strtok(NULL, " \t\n");

	if (q == NULL) {
		log_err("opt \"%s\" arg is null", p);
		goto err;
	}

	if (strcmp(p, "--sport") == 0) {
		if (parse_port(q, m->src) != 0) {
			goto err;
		}

		inv_type = INV_UDP_SRC;
	} else if (strcmp(p, "--dport") == 0) {
		if (parse_port(q, m->dst) != 0) {
			goto err;
		}

		inv_type = INV_UDP_DST;
	}

	if (inv && inv_type) {
		m->invert |= inv_type;
	}

	p = q;
	return 0;
err:
	return -1;
}